

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O2

size_t iDynTree::countUnknowns(Traversal *traversal,LinkUnknownWrenchContacts *unknownWrenches)

{
  int iVar1;
  pointer pvVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  size_t sVar6;
  bool bVar7;
  
  iVar3 = iDynTree::Traversal::getNrOfVisitedLinks();
  sVar6 = 0;
  while (iVar3 = iVar3 + -1, -1 < iVar3) {
    iDynTree::Traversal::getLink((long)traversal);
    lVar4 = iDynTree::Link::getIndex();
    pvVar2 = (unknownWrenches->m_linkUnknownWrenchContacts).
             super__Vector_base<std::vector<iDynTree::UnknownWrenchContact,_std::allocator<iDynTree::UnknownWrenchContact>_>,_std::allocator<std::vector<iDynTree::UnknownWrenchContact,_std::allocator<iDynTree::UnknownWrenchContact>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar5 = *(int **)&pvVar2[lVar4].
                       super__Vector_base<iDynTree::UnknownWrenchContact,_std::allocator<iDynTree::UnknownWrenchContact>_>
                       ._M_impl;
    lVar4 = ((long)*(pointer *)
                    ((long)&pvVar2[lVar4].
                            super__Vector_base<iDynTree::UnknownWrenchContact,_std::allocator<iDynTree::UnknownWrenchContact>_>
                            ._M_impl + 8) - (long)piVar5) / 0x78;
    while (bVar7 = lVar4 != 0, lVar4 = lVar4 + -1, bVar7) {
      iVar1 = *piVar5;
      if (iVar1 == 2) {
        sVar6 = sVar6 + 1;
      }
      else if (iVar1 == 1) {
        sVar6 = sVar6 + 3;
      }
      else if (iVar1 == 0) {
        sVar6 = sVar6 + 6;
      }
      piVar5 = piVar5 + 0x1e;
    }
  }
  return sVar6;
}

Assistant:

size_t countUnknowns(const Traversal& traversal, const LinkUnknownWrenchContacts& unknownWrenches)
{
    size_t unknowns = 0;

    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();

        // While we are in this loop, we also keep track of the number of unknowns
        for(size_t contact = 0;
            contact < unknownWrenches.getNrOfContactsForLink(visitedLinkIndex);
            contact++ )
        {
            const UnknownWrenchContact & unknownWrench = unknownWrenches.contactWrench(visitedLinkIndex,contact);

            switch( unknownWrench.unknownType )
            {
                case FULL_WRENCH:
                    unknowns += 6;
                    break;
                case PURE_FORCE:
                    unknowns += 3;
                    break;
                case PURE_FORCE_WITH_KNOWN_DIRECTION:
                    unknowns += 1;
                    break;
                case NO_UNKNOWNS:
                    //unknowns += 0;
                    break;
                default:
                    assert(false);
                    break;
            }
        }
    }

    return unknowns;
}